

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O0

void __thiscall SpiAnalyzer::AdvanceToActiveEnableEdge(SpiAnalyzer *this)

{
  BitState BVar1;
  element_type *peVar2;
  U64 UVar3;
  SpiAnalyzer *this_local;
  
  if (this->mEnable == (AnalyzerChannelData *)0x0) {
    UVar3 = AnalyzerChannelData::GetSampleNumber();
    this->mCurrentSample = UVar3;
  }
  else {
    BVar1 = AnalyzerChannelData::GetBitState();
    peVar2 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
    if (BVar1 == peVar2->mEnableActiveState) {
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    UVar3 = AnalyzerChannelData::GetSampleNumber();
    this->mCurrentSample = UVar3;
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
  }
  return;
}

Assistant:

void SpiAnalyzer::AdvanceToActiveEnableEdge()
{
    if( mEnable != NULL )
    {
        if( mEnable->GetBitState() != mSettings->mEnableActiveState )
        {
            mEnable->AdvanceToNextEdge();
        }
        else
        {
            mEnable->AdvanceToNextEdge();
            mEnable->AdvanceToNextEdge();
        }
        mCurrentSample = mEnable->GetSampleNumber();
        mClock->AdvanceToAbsPosition( mCurrentSample );
    }
    else
    {
        mCurrentSample = mClock->GetSampleNumber();
    }
}